

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSPI.cpp
# Opt level: O1

Name __thiscall
wasm::JSPI::makeWrapperForExport(JSPI *this,Function *func,Module *module,Name suspender)

{
  undefined8 *puVar1;
  pointer *ppNVar2;
  char *pcVar3;
  uintptr_t uVar4;
  Module *this_00;
  _Head_base<0UL,_wasm::Function_*,_false> _Var5;
  undefined1 auVar6 [8];
  pointer pTVar7;
  undefined8 *puVar8;
  Expression *pEVar9;
  Type *pTVar10;
  Block *this_01;
  GlobalSet *this_02;
  Const *item;
  Function *pFVar11;
  undefined1 reuse;
  function<bool_(wasm::Name)> *check;
  Type TVar12;
  pointer pNVar13;
  Index index;
  MixedArena *this_03;
  ExpressionList *this_04;
  Name root;
  Name root_00;
  string_view sVar14;
  Signature SVar15;
  Name name;
  HeapType local_130;
  Type local_128;
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *local_120;
  Type *local_118;
  char *local_110;
  size_t local_108;
  string_view local_100;
  Module *local_f0;
  _Head_base<0UL,_wasm::Function_*,_false> local_e8;
  Type *local_e0;
  HeapType *local_d8;
  Expression *local_d0;
  string_view local_c8;
  pointer local_b8 [2];
  pointer *ppNStack_a8;
  vector<wasm::NameType,_std::allocator<wasm::NameType>_> namedWrapperParams;
  Builder local_88;
  Builder builder;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> wrapperFunc;
  Iterator __begin2;
  undefined1 auStack_58 [8];
  vector<wasm::Type,_std::allocator<wasm::Type>_> wrapperParams;
  
  local_c8._M_str = (char *)local_c8._M_len;
  local_110 = suspender.super_IString.str._M_str;
  ppNStack_a8 = &namedWrapperParams.
                 super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>._M_impl.
                 super__Vector_impl_data._M_finish;
  std::__cxx11::string::_M_construct<char_const*>((string *)&ppNStack_a8,"export$","");
  pcVar3 = (func->super_Importable).super_Named.name.super_IString.str._M_str;
  local_e8._M_head_impl = func;
  local_c8._M_len = (size_t)local_b8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_c8,pcVar3,
             pcVar3 + (func->super_Importable).super_Named.name.super_IString.str._M_len);
  ppNVar2 = &namedWrapperParams.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  pNVar13 = (pointer)0xf;
  if (ppNStack_a8 != ppNVar2) {
    pNVar13 = namedWrapperParams.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  }
  if (pNVar13 < (pointer)(local_c8._M_str +
                         (long)&((namedWrapperParams.
                                  super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->name).super_IString))
  {
    pNVar13 = (pointer)0xf;
    if ((pointer *)local_c8._M_len != local_b8) {
      pNVar13 = local_b8[0];
    }
    if ((pointer)(local_c8._M_str +
                 (long)&((namedWrapperParams.
                          super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>.
                          _M_impl.super__Vector_impl_data._M_start)->name).super_IString) <= pNVar13
       ) {
      puVar8 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_c8,0,(char *)0x0,(ulong)ppNStack_a8);
      goto LAB_00771051;
    }
  }
  puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&ppNStack_a8,local_c8._M_len);
LAB_00771051:
  auStack_58 = (undefined1  [8])
               &wrapperParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                super__Vector_impl_data._M_finish;
  puVar1 = puVar8 + 2;
  if ((pointer *)*puVar8 == (pointer *)puVar1) {
    wrapperParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)*puVar1;
    wrapperParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)puVar8[3];
  }
  else {
    wrapperParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)*puVar1;
    auStack_58 = (undefined1  [8])*puVar8;
  }
  wrapperParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)puVar8[1];
  *puVar8 = puVar1;
  puVar8[1] = 0;
  *(undefined1 *)puVar1 = 0;
  sVar14._M_str = (char *)0x0;
  sVar14._M_len = (size_t)auStack_58;
  sVar14 = IString::interned((IString *)
                             wrapperParams.
                             super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                             super__Vector_impl_data._M_start,sVar14,SUB81(puVar1,0));
  check = (function<bool_(wasm::Name)> *)&wrapperFunc;
  root.super_IString.str._M_str = (char *)check;
  root.super_IString.str._M_len = (size_t)sVar14._M_str;
  wrapperFunc._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
  super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
  super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl =
       (__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true>)
       (__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true>)module;
  local_100 = (string_view)Names::getValidName((Names *)sVar14._M_len,root,check);
  reuse = SUB81(check,0);
  std::
  _Function_handler<bool_(wasm::Name),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/names.h:72:11)>
  ::_M_manager((_Any_data *)&wrapperFunc,(_Any_data *)&wrapperFunc,__destroy_functor);
  if (auStack_58 !=
      (undefined1  [8])
      &wrapperParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
       super__Vector_impl_data._M_finish) {
    operator_delete((void *)auStack_58,
                    (ulong)((long)&(wrapperParams.
                                    super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                                    _M_impl.super__Vector_impl_data._M_finish)->id + 1));
  }
  if ((pointer *)local_c8._M_len != local_b8) {
    operator_delete((void *)local_c8._M_len,
                    (ulong)((long)&(local_b8[0]->name).super_IString.str._M_len + 1));
  }
  local_108 = suspender.super_IString.str._M_len;
  if (ppNStack_a8 != ppNVar2) {
    operator_delete(ppNStack_a8,
                    (ulong)((long)&((namedWrapperParams.
                                     super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>
                                     ._M_impl.super__Vector_impl_data._M_finish)->name).
                                   super_IString.str._M_len + 1));
  }
  local_88.wasm = module;
  pEVar9 = (Expression *)MixedArena::allocSpace(&module->allocator,0x48,8);
  _Var5._M_head_impl = local_e8._M_head_impl;
  pEVar9->_id = CallId;
  (pEVar9->type).id = 0;
  *(undefined8 *)(pEVar9 + 1) = 0;
  pEVar9[1].type.id = 0;
  *(undefined8 *)(pEVar9 + 2) = 0;
  pEVar9[2].type.id = (uintptr_t)&module->allocator;
  *(undefined8 *)(pEVar9 + 3) = 0;
  pEVar9[3].type.id = 0;
  *(undefined1 *)&pEVar9[4]._id = InvalidId;
  pcVar3 = ((local_e8._M_head_impl)->super_Importable).super_Named.name.super_IString.str._M_str;
  *(size_t *)(pEVar9 + 3) =
       ((local_e8._M_head_impl)->super_Importable).super_Named.name.super_IString.str._M_len;
  pEVar9[3].type.id = (uintptr_t)pcVar3;
  local_d8 = &(local_e8._M_head_impl)->type;
  SVar15 = HeapType::getSignature(local_d8);
  (pEVar9->type).id = SVar15.results.id.id;
  wrapperParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  auStack_58 = (undefined1  [8])0x0;
  wrapperParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  namedWrapperParams.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ppNStack_a8 = (pointer *)0x0;
  namedWrapperParams.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_d0 = pEVar9;
  std::vector<wasm::Type,std::allocator<wasm::Type>>::_M_realloc_insert<wasm::Type_const&>
            ((vector<wasm::Type,std::allocator<wasm::Type>> *)auStack_58,(iterator)0x0,
             &this->externref);
  sVar14 = IString::interned((IString *)0x4,(string_view)ZEXT816(0xb812a2),(bool)reuse);
  wrapperFunc._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
  super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
  super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl =
       (__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true>)
       (__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true>)
       _Var5._M_head_impl;
  root_00.super_IString.str._M_str = (char *)&wrapperFunc;
  root_00.super_IString.str._M_len = (size_t)sVar14._M_str;
  local_e0 = &this->externref;
  sVar14 = (string_view)
           Names::getValidName((Names *)sVar14._M_len,root_00,
                               (function<bool_(wasm::Name)> *)&wrapperFunc);
  std::
  _Function_handler<bool_(wasm::Name),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/names.h:96:23)>
  ::_M_manager((_Any_data *)&wrapperFunc,(_Any_data *)&wrapperFunc,__destroy_functor);
  local_c8 = sVar14;
  std::vector<wasm::NameType,std::allocator<wasm::NameType>>::emplace_back<wasm::Name,wasm::Type&>
            ((vector<wasm::NameType,std::allocator<wasm::NameType>> *)&ppNStack_a8,(Name *)&local_c8
             ,local_e0);
  SVar15 = HeapType::getSignature(local_d8);
  builder.wasm = (Module *)SVar15.params.id;
  __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent = (Type *)0x0;
  local_f0 = module;
  wrapperFunc._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
  super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
  super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl =
       (__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true>)
       (__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true>)&builder;
  pTVar10 = (Type *)wasm::Type::size((Type *)&builder);
  if ((pTVar10 != (Type *)0x0) ||
     (wrapperFunc._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
      _M_t.super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
      super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl !=
      (__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true>)&builder)) {
    local_120 = (ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                (local_d0 + 1);
    index = 0;
    local_118 = pTVar10;
    do {
      pTVar10 = wasm::Type::Iterator::operator*((Iterator *)&wrapperFunc);
      pTVar7 = wrapperParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
               super__Vector_impl_data._M_start;
      auVar6 = auStack_58;
      uVar4 = pTVar10->id;
      pEVar9 = (Expression *)MixedArena::allocSpace(&(local_88.wasm)->allocator,0x18,8);
      pEVar9->_id = LocalGetId;
      pEVar9[1]._id = (Id)((ulong)((long)pTVar7 - (long)auVar6) >> 3);
      (pEVar9->type).id = uVar4;
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                (local_120,pEVar9);
      if (wrapperParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
          super__Vector_impl_data._M_start ==
          wrapperParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        std::vector<wasm::Type,std::allocator<wasm::Type>>::_M_realloc_insert<wasm::Type_const&>
                  ((vector<wasm::Type,std::allocator<wasm::Type>> *)auStack_58,
                   (iterator)
                   wrapperParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl
                   .super__Vector_impl_data._M_start,pTVar10);
      }
      else {
        (wrapperParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
         super__Vector_impl_data._M_start)->id = pTVar10->id;
        wrapperParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
        super__Vector_impl_data._M_start =
             wrapperParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
             super__Vector_impl_data._M_start + 1;
      }
      local_c8 = (string_view)Function::getLocalNameOrGeneric(local_e8._M_head_impl,index);
      std::vector<wasm::NameType,std::allocator<wasm::NameType>>::
      emplace_back<wasm::Name,wasm::Type_const&>
                ((vector<wasm::NameType,std::allocator<wasm::NameType>> *)&ppNStack_a8,
                 (Name *)&local_c8,pTVar10);
      index = index + 1;
      __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
           (Type *)((long)&(__begin2.
                            super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                           parent)->id + 1);
    } while ((__begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent !=
              local_118) ||
            (wrapperFunc._M_t.
             super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
             super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
             super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl !=
             (__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true>)
             &builder));
  }
  this_03 = &(local_88.wasm)->allocator;
  this_01 = (Block *)MixedArena::allocSpace(this_03,0x40,8);
  (this_01->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression._id = BlockId;
  (this_01->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id = 0;
  (this_01->name).super_IString.str._M_len = 0;
  (this_01->name).super_IString.str._M_str = (char *)0x0;
  (this_01->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data =
       (Expression **)0x0;
  (this_01->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
  usedElements = 0;
  (this_01->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
  allocatedElements = 0;
  (this_01->list).allocator = this_03;
  uVar4 = local_e0->id;
  pEVar9 = (Expression *)MixedArena::allocSpace(&(local_88.wasm)->allocator,0x18,8);
  pEVar9->_id = LocalGetId;
  pEVar9[1]._id = InvalidId;
  (pEVar9->type).id = uVar4;
  this_02 = (GlobalSet *)MixedArena::allocSpace(&(local_88.wasm)->allocator,0x28,8);
  (this_02->super_SpecificExpression<(wasm::Expression::Id)11>).super_Expression._id = GlobalSetId;
  (this_02->super_SpecificExpression<(wasm::Expression::Id)11>).super_Expression.type.id = 0;
  (this_02->name).super_IString.str._M_len = 0;
  (this_02->name).super_IString.str._M_len = local_108;
  (this_02->name).super_IString.str._M_str = local_110;
  this_02->value = pEVar9;
  GlobalSet::finalize(this_02);
  this_04 = &this_01->list;
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
            (&this_04->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
             (Expression *)this_02);
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
            (&this_04->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
             local_d0);
  SVar15 = HeapType::getSignature(local_d8);
  this_00 = local_f0;
  TVar12 = SVar15.results.id;
  if (TVar12.id == 0) {
    item = Builder::makeConst<int>(&local_88,0);
    TVar12.id = 2;
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              (&this_04->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
               (Expression *)item);
  }
  Block::finalize(this_01);
  Tuple::Tuple((Tuple *)&wrapperFunc,(TypeList *)auStack_58);
  wasm::Type::Type(&local_128,(Tuple *)&wrapperFunc);
  SVar15.results.id = TVar12.id;
  SVar15.params.id = local_128.id;
  HeapType::HeapType(&local_130,SVar15);
  local_c8 = (string_view)ZEXT816(0);
  local_b8[0] = (pointer)0x0;
  name.super_IString.str._M_str = (char *)local_100._M_len;
  name.super_IString.str._M_len = (size_t)&builder;
  Builder::makeFunction
            (name,(vector<wasm::NameType,_std::allocator<wasm::NameType>_> *)local_100._M_str,
             (HeapType)&ppNStack_a8,
             (vector<wasm::NameType,_std::allocator<wasm::NameType>_> *)local_130.id,
             (Expression *)&local_c8);
  if ((void *)local_c8._M_len != (void *)0x0) {
    operator_delete((void *)local_c8._M_len,(long)local_b8[0] - local_c8._M_len);
  }
  if ((__uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>)
      wrapperFunc._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
      _M_t.super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
      super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>)0x0) {
    operator_delete((void *)wrapperFunc._M_t.
                            super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                            .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl,
                    (long)std::
                          _Function_handler<bool_(wasm::Name),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/names.h:96:23)>
                          ::_M_manager -
                    (long)wrapperFunc._M_t.
                          super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                          .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl);
  }
  pFVar11 = Module::addFunction(this_00,(unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>
                                         *)&builder);
  sVar14 = (pFVar11->super_Importable).super_Named.name.super_IString.str;
  std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::~unique_ptr
            ((unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)&builder);
  if (ppNStack_a8 != (pointer *)0x0) {
    operator_delete(ppNStack_a8,
                    (long)namedWrapperParams.
                          super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)ppNStack_a8);
  }
  if (auStack_58 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_58,
                    (long)wrapperParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)auStack_58);
  }
  return (IString)(IString)sVar14;
}

Assistant:

Name makeWrapperForExport(Function* func, Module* module, Name suspender) {
    Name wrapperName = Names::getValidFunctionName(
      *module, std::string("export$") + func->name.toString());

    Builder builder(*module);

    auto* call = module->allocator.alloc<Call>();
    call->target = func->name;
    call->type = func->getResults();

    // Add an externref param as the first argument and copy all the original
    // params to new export.
    std::vector<Type> wrapperParams;
    std::vector<NameType> namedWrapperParams;
    wrapperParams.push_back(externref);
    namedWrapperParams.emplace_back(Names::getValidLocalName(*func, "susp"),
                                    externref);
    Index i = 0;
    for (const auto& param : func->getParams()) {
      call->operands.push_back(
        builder.makeLocalGet(wrapperParams.size(), param));
      wrapperParams.push_back(param);
      namedWrapperParams.emplace_back(func->getLocalNameOrGeneric(i), param);
      i++;
    }
    auto* block = builder.makeBlock();
    block->list.push_back(
      builder.makeGlobalSet(suspender, builder.makeLocalGet(0, externref)));
    block->list.push_back(call);
    Type resultsType = func->getResults();
    if (resultsType == Type::none) {
      // A void return is not currently allowed by v8. Add an i32 return value
      // that is ignored.
      // https://bugs.chromium.org/p/v8/issues/detail?id=13231
      resultsType = Type::i32;
      block->list.push_back(builder.makeConst(0));
    }
    block->finalize();
    auto wrapperFunc =
      Builder::makeFunction(wrapperName,
                            std::move(namedWrapperParams),
                            Signature(Type(wrapperParams), resultsType),
                            {},
                            block);
    return module->addFunction(std::move(wrapperFunc))->name;
  }